

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.c
# Opt level: O2

float ** directions(PGMData *gy,PGMData *gx)

{
  uint uVar1;
  uint uVar2;
  float **ppfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  int j;
  long lVar8;
  float fVar9;
  
  ppfVar3 = mem_alloc(gy->row,gy->col);
  uVar2 = gy->row;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    uVar1 = gy->col;
    if (gy->col < 1) {
      uVar1 = 0;
    }
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      ppfVar3[uVar5][uVar6] = 0.0;
    }
  }
  for (lVar7 = 0; lVar7 < (int)uVar2; lVar7 = lVar7 + 1) {
    for (lVar8 = 0; lVar8 < gy->col; lVar8 = lVar8 + 1) {
      fVar9 = atanf(gy->pixel_matrix[lVar7][lVar8] / gx->pixel_matrix[lVar7][lVar8]);
      ppfVar3[lVar7][lVar8] = fVar9;
    }
    uVar2 = gy->row;
  }
  return ppfVar3;
}

Assistant:

float **directions(PGMData *gy, PGMData *gx)
{
    float **dir_matrix = mem_alloc(gy->row, gy->col);
    for (int i = 0; i < gy->row; ++i)
    {
        for (int j = 0; j < gy->col; ++j)
        {
            dir_matrix[i][j] = 0;
        }
    }

    for (int i = 0; i < gy->row; ++i)
    {
        for (int j = 0; j < gy->col; ++j)
        {
            dir_matrix[i][j] = atanf(gy->pixel_matrix[i][j] / gx->pixel_matrix[i][j]);
        }
    }

    return dir_matrix;
}